

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

size_t mg_printf_data(mg_connection *c,char *fmt,...)

{
  char in_AL;
  int len_00;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_2108 [16];
  undefined8 local_20f8;
  undefined8 local_20f0;
  undefined8 local_20e8;
  undefined8 local_20e0;
  undefined8 local_20d8;
  undefined8 local_20c8;
  undefined8 local_20b8;
  undefined8 local_20a8;
  undefined8 local_2098;
  undefined8 local_2088;
  undefined8 local_2078;
  undefined8 local_2068;
  char **local_2050;
  char *buf;
  char mem [8192];
  undefined1 local_38 [4];
  int len;
  va_list ap;
  connection *conn;
  char *fmt_local;
  mg_connection *c_local;
  
  if (in_AL != '\0') {
    local_20d8 = in_XMM0_Qa;
    local_20c8 = in_XMM1_Qa;
    local_20b8 = in_XMM2_Qa;
    local_20a8 = in_XMM3_Qa;
    local_2098 = in_XMM4_Qa;
    local_2088 = in_XMM5_Qa;
    local_2078 = in_XMM6_Qa;
    local_2068 = in_XMM7_Qa;
  }
  ap[0].reg_save_area = &c[-1].callback_param;
  local_2050 = &buf;
  local_20f8 = in_RDX;
  local_20f0 = in_RCX;
  local_20e8 = in_R8;
  local_20e0 = in_R9;
  terminate_headers(c);
  ap[0].overflow_arg_area = local_2108;
  ap[0]._0_8_ = &stack0x00000008;
  len = 0x30;
  local_38 = (undefined1  [4])0x10;
  len_00 = ns_avprintf((char **)&local_2050,0x2000,fmt,(__va_list_tag *)local_38);
  if (-1 < len_00) {
    write_chunk((connection *)ap[0].reg_save_area,(char *)local_2050,len_00);
  }
  if ((local_2050 != &buf) && (local_2050 != (char **)0x0)) {
    free(local_2050);
  }
  return *(size_t *)(*ap[0].reg_save_area + 0x58);
}

Assistant:

size_t mg_printf_data(struct mg_connection *c, const char *fmt, ...) {
  struct connection *conn = MG_CONN_2_CONN(c);
  va_list ap;
  int len;
  char mem[IOBUF_SIZE], *buf = mem;

  terminate_headers(c);

  va_start(ap, fmt);
  len = ns_avprintf(&buf, sizeof(mem), fmt, ap);
  va_end(ap);

  if (len >= 0) {
    write_chunk((struct connection *) conn, buf, len);
  }
  if (buf != mem && buf != NULL) {
    free(buf);
  }
  return conn->ns_conn->send_iobuf.len;
}